

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O3

void ht_task_scheduler_destroy(HT_TaskScheduler *task_scheduler)

{
  void *__ptr;
  realloc_function p_Var1;
  ulong uVar2;
  
  if ((task_scheduler->tasks).size != 0) {
    uVar2 = 0;
    p_Var1 = realloc_fnc_;
    do {
      __ptr = (task_scheduler->tasks).data[uVar2];
      if (p_Var1 == (realloc_function)0x0) {
        free(__ptr);
        p_Var1 = (realloc_function)0x0;
      }
      else {
        (*p_Var1)(__ptr,0,user_data_);
        p_Var1 = realloc_fnc_;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (task_scheduler->tasks).size);
  }
  ht_bag_void_ptr_deinit(&task_scheduler->tasks);
  if (realloc_fnc_ != (realloc_function)0x0) {
    (*realloc_fnc_)(task_scheduler,0,user_data_);
    return;
  }
  free(task_scheduler);
  return;
}

Assistant:

void
ht_task_scheduler_destroy(HT_TaskScheduler* task_scheduler)
{
    size_t i = 0;
    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        ht_free(task_scheduler->tasks.data[i]);
    }

    ht_bag_void_ptr_deinit(&task_scheduler->tasks);
    ht_free(task_scheduler);
}